

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O0

ValuedAction __thiscall despot::DPOMCP::Search(DPOMCP *this,double timeout)

{
  Belief *pBVar1;
  DSPOMDP *pDVar2;
  int iVar3;
  clock_t cVar4;
  VNode *pVVar5;
  size_type sVar6;
  reference ppSVar7;
  log_ostream *plVar8;
  clock_t cVar9;
  ostream *poVar10;
  QNode *pQVar11;
  void *pvVar12;
  double dVar13;
  double dVar14;
  ValuedAction VVar15;
  ACT_TYPE local_84;
  int local_80;
  ACT_TYPE action;
  int i;
  undefined1 local_70 [8];
  RandomStreams streams;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  double start_real;
  double start_cpu;
  double timeout_local;
  DPOMCP *this_local;
  ValuedAction astar;
  
  cVar4 = clock();
  dVar13 = get_time_second();
  pBVar1 = (this->super_POMCP).super_Solver.belief_;
  (*pBVar1->_vptr_Belief[2])(&streams.position_,pBVar1,(ulong)(uint)DAT_00278a6c);
  RandomStreams::RandomStreams((RandomStreams *)local_70,DAT_00278a6c,DAT_00278a70);
  pVVar5 = ConstructTree((vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                         &streams.position_,(RandomStreams *)local_70,
                         (this->super_POMCP).super_Solver.model_,(this->super_POMCP).prior_,
                         &(this->super_POMCP).super_Solver.history_,timeout);
  (this->super_POMCP).root_ = pVVar5;
  for (local_80 = 0;
      sVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                         &streams.position_), (ulong)(long)local_80 < sVar6; local_80 = local_80 + 1
      ) {
    pDVar2 = (this->super_POMCP).super_Solver.model_;
    ppSVar7 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                         &streams.position_,(long)local_80);
    (*pDVar2->_vptr_DSPOMDP[0x17])(pDVar2,*ppSVar7);
  }
  iVar3 = logging::level();
  if ((0 < iVar3) && (iVar3 = logging::level(), 2 < iVar3)) {
    plVar8 = logging::stream(3);
    poVar10 = std::operator<<(&plVar8->super_ostream,"[DPOMCP::Search] Time: CPU / Real = ");
    cVar9 = clock();
    poVar10 = (ostream *)
              std::ostream::operator<<(poVar10,((double)cVar9 - (double)cVar4) / 1000000.0);
    poVar10 = std::operator<<(poVar10," / ");
    dVar14 = get_time_second();
    pvVar12 = (void *)std::ostream::operator<<(poVar10,dVar14 - dVar13);
    poVar10 = (ostream *)std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
    poVar10 = std::operator<<(poVar10,"Tree size = ");
    iVar3 = VNode::Size((this->super_POMCP).root_);
    pvVar12 = (void *)std::ostream::operator<<(poVar10,iVar3);
    std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
  }
  VVar15 = POMCP::OptimalAction((this->super_POMCP).root_);
  if (VVar15.action == 0xffffffff) {
    for (local_84 = 0; iVar3 = (*((this->super_POMCP).super_Solver.model_)->_vptr_DSPOMDP[5])(),
        local_84 < iVar3; local_84 = local_84 + 1) {
      poVar10 = std::operator<<((ostream *)&std::cout,"action ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_84);
      poVar10 = std::operator<<(poVar10,": ");
      pQVar11 = VNode::Child((this->super_POMCP).root_,local_84);
      iVar3 = QNode::count(pQVar11);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar3);
      poVar10 = std::operator<<(poVar10," ");
      pQVar11 = VNode::Child((this->super_POMCP).root_,local_84);
      dVar13 = QNode::value(pQVar11);
      pvVar12 = (void *)std::ostream::operator<<(poVar10,dVar13);
      std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
    }
  }
  pVVar5 = (this->super_POMCP).root_;
  if (pVVar5 != (VNode *)0x0) {
    VNode::~VNode(pVVar5);
    operator_delete(pVVar5,0x98);
  }
  RandomStreams::~RandomStreams((RandomStreams *)local_70);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&streams.position_);
  VVar15._4_4_ = 0;
  return VVar15;
}

Assistant:

ValuedAction DPOMCP::Search(double timeout) {
	double start_cpu = clock(), start_real = get_time_second();

	vector<State*> particles = belief_->Sample(Globals::config.num_scenarios);

	RandomStreams streams(Globals::config.num_scenarios,
		Globals::config.search_depth);

	root_ = ConstructTree(particles, streams, model_, prior_, history_,
		timeout);

	for (int i = 0; i < particles.size(); i++)
		model_->Free(particles[i]);

	logi << "[DPOMCP::Search] Time: CPU / Real = "
		<< ((clock() - start_cpu) / CLOCKS_PER_SEC) << " / "
		<< (get_time_second() - start_real) << endl << "Tree size = "
		<< root_->Size() << endl;

	ValuedAction astar = OptimalAction(root_);
	if (astar.action == -1) {
		for (ACT_TYPE action = 0; action < model_->NumActions(); action++) {
			cout << "action " << action << ": " << root_->Child(action)->count()
				<< " " << root_->Child(action)->value() << endl;
		}
	}

	delete root_;
	return astar;
}